

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Option * __thiscall kj::Arena::allocate<kj::MainBuilder::Impl::Option>(Arena *this)

{
  Option *location;
  Option *result;
  Arena *this_local;
  
  location = (Option *)allocateBytes(this,0x40,8,false);
  ctor<kj::MainBuilder::Impl::Option>(location);
  return location;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}